

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbr2_probe_bw.cc
# Opt level: O3

bool __thiscall
quic::Bbr2ProbeBwMode::IsTimeToProbeBandwidth
          (Bbr2ProbeBwMode *this,Bbr2CongestionEvent *congestion_event)

{
  uint32_t *puVar1;
  bool bVar2;
  bool bVar3;
  
  bVar3 = true;
  if ((congestion_event->event_time).time_ - (this->cycle_).cycle_start_time.time_ <=
      (this->cycle_).probe_wait_time.time_offset_) {
    bVar2 = IsTimeToProbeForRenoCoexistence(this,1.0,congestion_event);
    if (bVar2) {
      puVar1 = &((this->super_Bbr2ModeBase).sender_)->connection_stats_->
                bbr_num_short_cycles_for_reno_coexistence;
      *puVar1 = *puVar1 + 1;
    }
    else {
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool Bbr2ProbeBwMode::HasCycleLasted(
    QuicTime::Delta duration,
    const Bbr2CongestionEvent& congestion_event) const {
  bool result =
      (congestion_event.event_time - cycle_.cycle_start_time) > duration;
  //QUIC_DVLOG(3) << sender_ << " " << cycle_.phase
  //              << ": HasCycleLasted=" << result << ". elapsed:"
  //              << (congestion_event.event_time - cycle_.cycle_start_time)
  //              << ", duration:" << duration;
  return result;
}